

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O2

void __thiscall smf::MidiMessage::makePitchBendDouble(MidiMessage *this,int channel,double value)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  uchar msb;
  uchar lsb;
  byte local_2b;
  byte local_2a;
  byte local_29;
  double local_28;
  
  local_28 = value;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0);
  dVar2 = (local_28 + 1.0) * 32768.0;
  dVar3 = 0.0;
  if (0.0 <= dVar2) {
    dVar3 = dVar2;
  }
  dVar2 = 32767.0;
  if (dVar3 <= 32767.0) {
    dVar2 = dVar3;
  }
  uVar1 = (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f | (long)dVar2;
  local_29 = (byte)uVar1 & 0x7f;
  local_2a = (byte)((uint)uVar1 >> 7) & 0x7f;
  local_2b = (byte)channel | 0xe0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_2b);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_29);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_2a);
  return;
}

Assistant:

void MidiMessage::makePitchBendDouble(int channel, double value) {
	// value is in the range from -1 for minimum and 2^18 - 1 for the maximum
	resize(0);
	double dvalue = (value + 1.0) * (pow(2.0, 15.0));
	if (dvalue < 0.0) {
		dvalue = 0.0;
	}
	if (dvalue > pow(2.0, 15.0) - 1.0) {
		dvalue = pow(2.0, 15.0) - 1.0;
	}
	ulong uivalue = (ulong)dvalue;
	uchar lsb = uivalue & 0x7f;
	uchar msb = (uivalue >> 7) & 0x7f;
	push_back(0xe0 | (0x7f & channel));
	push_back(lsb);
	push_back(msb);
}